

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radio.cpp
# Opt level: O0

void __thiscall zmq::radio_t::xpipe_terminated(radio_t *this,pipe_t *pipe_)

{
  bool bVar1;
  pointer ppVar2;
  pipe_t *in_RSI;
  iterator in_RDI;
  iterator it_1;
  iterator end_1;
  iterator end;
  iterator it;
  pipe_t *in_stack_ffffffffffffff88;
  dist_t *in_stack_ffffffffffffff90;
  __normal_iterator<zmq::pipe_t_**,_std::vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>_>
  in_stack_ffffffffffffffa0;
  const_iterator in_stack_ffffffffffffffa8;
  _Self local_20;
  _Self local_18;
  pipe_t *local_10;
  
  local_10 = in_RSI;
  local_18._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*>_>_>
       ::begin((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*>_>_>
                *)in_stack_ffffffffffffff88);
  local_20._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*>_>_>
       ::end((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*>_>_>
              *)in_stack_ffffffffffffff88);
  while (bVar1 = std::operator!=(&local_18,&local_20), bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*>_>
                           *)0x21c98e);
    if (ppVar2->second == local_10) {
      local_18._M_node =
           (_Base_ptr)
           std::
           multimap<std::__cxx11::string,zmq::pipe_t*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,zmq::pipe_t*>>>
           ::erase_abi_cxx11_((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*>_>_>
                               *)in_stack_ffffffffffffff90,in_RDI);
    }
    else {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*>_>
                    *)in_stack_ffffffffffffff90);
    }
  }
  std::vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>::end
            ((vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_> *)in_stack_ffffffffffffff88);
  std::vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>::begin
            ((vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_> *)in_stack_ffffffffffffff88);
  std::
  find<__gnu_cxx::__normal_iterator<zmq::pipe_t**,std::vector<zmq::pipe_t*,std::allocator<zmq::pipe_t*>>>,zmq::pipe_t*>
            ((__normal_iterator<zmq::pipe_t_**,_std::vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>_>
              )in_stack_ffffffffffffffa8._M_current,in_stack_ffffffffffffffa0,
             (pipe_t **)in_RDI._M_node);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<zmq::pipe_t_**,_std::vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>_>
                      *)in_stack_ffffffffffffff90,
                     (__normal_iterator<zmq::pipe_t_**,_std::vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>_>
                      *)in_stack_ffffffffffffff88);
  if (bVar1) {
    in_stack_ffffffffffffff90 = (dist_t *)&in_RDI._M_node[0x38]._M_right;
    __gnu_cxx::
    __normal_iterator<zmq::pipe_t*const*,std::vector<zmq::pipe_t*,std::allocator<zmq::pipe_t*>>>::
    __normal_iterator<zmq::pipe_t**>
              ((__normal_iterator<zmq::pipe_t_*const_*,_std::vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>_>
                *)in_stack_ffffffffffffff90,
               (__normal_iterator<zmq::pipe_t_**,_std::vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>_>
                *)in_stack_ffffffffffffff88);
    std::vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>::erase
              ((vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_> *)
               in_stack_ffffffffffffffa0._M_current,in_stack_ffffffffffffffa8);
  }
  dist_t::pipe_terminated(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return;
}

Assistant:

void zmq::radio_t::xpipe_terminated (pipe_t *pipe_)
{
    for (subscriptions_t::iterator it = _subscriptions.begin (),
                                   end = _subscriptions.end ();
         it != end;) {
        if (it->second == pipe_) {
#if __cplusplus >= 201103L || (defined _MSC_VER && _MSC_VER >= 1700)
            it = _subscriptions.erase (it);
#else
            _subscriptions.erase (it++);
#endif
        } else {
            ++it;
        }
    }

    {
        const udp_pipes_t::iterator end = _udp_pipes.end ();
        const udp_pipes_t::iterator it =
          std::find (_udp_pipes.begin (), end, pipe_);
        if (it != end)
            _udp_pipes.erase (it);
    }

    _dist.pipe_terminated (pipe_);
}